

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O1

bool __thiscall
Rml::DecoratorTiledInstancer::GetTileProperties
          (DecoratorTiledInstancer *this,Tile *tiles,Texture *textures,size_t num_tiles_and_textures
          ,PropertyDictionary *properties,DecoratorInstancerInterface *instancer_interface)

{
  Vector2Type VVar1;
  Unit UVar2;
  Spritesheet *pSVar3;
  code *pcVar4;
  Vector2f VVar5;
  PropertyDictionary *this_00;
  bool bVar6;
  bool bVar7;
  int iVar8;
  Property *pPVar9;
  Sprite *pSVar10;
  RenderManager *render_manager;
  pointer pTVar11;
  float fVar12;
  ulong uVar13;
  float *pfVar14;
  int dimension;
  Texture *this_01;
  long lVar15;
  Texture TVar16;
  String texture_name;
  String previous_texture_name;
  Property *align_properties [2];
  bool local_111;
  String local_110;
  TextureFileIndex local_f0;
  StableVectorIndex local_ec;
  pointer local_e8;
  PropertyDictionary *local_e0;
  DecoratorInstancerInterface *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  RenderManager *local_98;
  Tile *local_90;
  Tile *local_88;
  size_t local_80;
  undefined1 *local_78;
  size_t local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  Texture *local_58;
  DecoratorTiledInstancer *local_50;
  Property *local_48 [3];
  
  local_d8 = instancer_interface;
  local_90 = tiles;
  local_80 = num_tiles_and_textures;
  local_58 = textures;
  local_50 = this;
  if ((((long)(this->tile_property_ids).
              super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->tile_property_ids).
             super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
             ._M_impl.super__Vector_impl_data._M_start) * -0x3333333333333333 -
       num_tiles_and_textures != 0) &&
     (bVar6 = Assert("RMLUI_ASSERT(num_tiles_and_textures == tile_property_ids.size())",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorTiled.cpp"
                     ,0x11f), !bVar6)) {
LAB_002134da:
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  local_78 = &local_68;
  local_70 = 0;
  local_68 = 0;
  local_111 = local_80 == 0;
  if (!local_111) {
    pfVar14 = &local_90->align[0].value;
    local_ec = Invalid;
    uVar13 = 0;
    local_f0 = Invalid;
    local_98 = (RenderManager *)0x0;
    local_e0 = properties;
    do {
      pTVar11 = (local_50->tile_property_ids).
                super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar9 = PropertyDictionary::GetProperty(local_e0,pTVar11[uVar13].src);
      Property::Get<std::__cxx11::string>(&local_d0,pPVar9);
      bVar6 = false;
      if ((local_d0._M_string_length != 0) &&
         (iVar8 = ::std::__cxx11::string::compare((char *)&local_d0), iVar8 != 0)) {
        local_e8 = pTVar11;
        pSVar10 = DecoratorInstancerInterface::GetSprite(local_d8,&local_d0);
        local_88 = local_90 + uVar13;
        this_01 = local_58 + uVar13;
        if (pSVar10 == (Sprite *)0x0) {
          if ((local_d0._M_string_length == local_70) &&
             ((local_d0._M_string_length == 0 ||
              (iVar8 = bcmp(local_d0._M_dataplus._M_p,local_78,local_d0._M_string_length),
              iVar8 == 0)))) {
            this_01->render_manager = local_98;
            this_01->file_index = local_f0;
            this_01->callback_index = local_ec;
          }
          else {
            TVar16 = DecoratorInstancerInterface::GetTexture(local_d8,&local_d0);
            *this_01 = TVar16;
            bVar7 = Texture::operator_cast_to_bool(this_01);
            bVar6 = true;
            if (!bVar7) goto LAB_0021343f;
            ::std::__cxx11::string::_M_assign((string *)&local_78);
            local_98 = this_01->render_manager;
            local_f0 = this_01->file_index;
            local_ec = this_01->callback_index;
          }
        }
        else {
          fVar12 = (pSVar10->rectangle).p0.y;
          (local_88->position).x = (pSVar10->rectangle).p0.x;
          (local_88->position).y = fVar12;
          VVar1 = (pSVar10->rectangle).p0;
          VVar5.y = (pSVar10->rectangle).p1.y - VVar1.y;
          VVar5.x = (pSVar10->rectangle).p1.x - VVar1.x;
          local_88->size = VVar5;
          pSVar3 = pSVar10->sprite_sheet;
          local_88->display_scale = pSVar3->display_scale;
          render_manager = DecoratorInstancerInterface::GetRenderManager(local_d8);
          TVar16 = TextureSource::GetTexture(&pSVar3->texture_source,render_manager);
          *this_01 = TVar16;
        }
        pTVar11 = local_e8 + uVar13;
        if (pTVar11->fit != Invalid) {
          if (((pTVar11->align_x == Invalid) || (pTVar11->align_y == Invalid)) &&
             (bVar6 = Assert("RMLUI_ASSERT(ids.align_x != PropertyId::Invalid && ids.align_y != PropertyId::Invalid)"
                             ,
                             "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorTiled.cpp"
                             ,0x159), !bVar6)) goto LAB_002134da;
          local_e8 = pTVar11;
          pPVar9 = PropertyDictionary::GetProperty(local_e0,pTVar11->fit);
          local_110._M_dataplus._M_p._0_4_ = 0.0;
          Variant::GetInto<int,_0>(&pPVar9->value,(int *)&local_110);
          this_00 = local_e0;
          pTVar11 = local_e8;
          local_88->fit_mode = (TileFitMode)local_110._M_dataplus._M_p._0_4_;
          if ((int)local_110._M_dataplus._M_p._0_4_ - 5 < 3 && pSVar10 != (Sprite *)0x0) {
            Property::ToString_abi_cxx11_(&local_110,pPVar9);
            Log::Message(LT_WARNING,
                         "Decorator \'fit\' value is \'%s\', which is incompatible with sprites",
                         CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_)
                        );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_) !=
                &local_110.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                       local_110._M_dataplus._M_p._0_4_),
                              local_110.field_2._M_allocated_capacity + 1);
            }
            bVar6 = true;
            goto LAB_0021343f;
          }
          local_48[0] = PropertyDictionary::GetProperty(local_e0,local_e8->align_x);
          local_48[1] = PropertyDictionary::GetProperty(this_00,pTVar11->align_y);
          lVar15 = 0;
          do {
            pPVar9 = local_48[lVar15];
            UVar2 = pPVar9->unit;
            if (UVar2 == PX) {
              local_110._M_dataplus._M_p._0_4_ = 0.0;
              Variant::GetInto<float,_0>(&pPVar9->value,(float *)&local_110);
              fVar12 = (float)((uint)local_9c & 0xffffff00);
              local_9c = fVar12;
LAB_00213368:
              pfVar14[lVar15 * 2 + -1] = fVar12;
              pfVar14[lVar15 * 2] = local_110._M_dataplus._M_p._0_4_;
            }
            else {
              if (UVar2 == PERCENT) {
                local_110._M_dataplus._M_p._0_4_ = 0.0;
                Variant::GetInto<float,_0>(&pPVar9->value,(float *)&local_110);
                fVar12 = (float)(((uint)local_a0 & 0xffffff00) + 1);
                local_a0 = fVar12;
                goto LAB_00213368;
              }
              if (UVar2 == KEYWORD) {
                local_110._M_dataplus._M_p._0_4_ = 0.0;
                Variant::GetInto<int,_0>(&pPVar9->value,(int *)&local_110);
                if (local_110._M_dataplus._M_p._0_4_ == 0.0) {
                  local_ac = (float)(((uint)local_ac & 0xffffff00) + 1);
                  pfVar14[lVar15 * 2 + -1] = local_ac;
                  pfVar14[lVar15 * 2] = 0.0;
                }
                else if (local_110._M_dataplus._M_p._0_4_ == 1.4013e-45) {
                  local_a8 = (float)(((uint)local_a8 & 0xffffff00) + 1);
                  pfVar14[lVar15 * 2 + -1] = local_a8;
                  pfVar14[lVar15 * 2] = 50.0;
                }
                else if (local_110._M_dataplus._M_p._0_4_ == 2.8026e-45) {
                  local_a4 = (float)(((uint)local_a4 & 0xffffff00) + 1);
                  pfVar14[lVar15 * 2 + -1] = local_a4;
                  pfVar14[lVar15 * 2] = 100.0;
                }
              }
              else {
                Property::ToString_abi_cxx11_(&local_110,pPVar9);
                Log::Message(LT_WARNING,
                             "Decorator alignment value is \'%s\' which uses an unsupported unit (use px, %%, or keyword)"
                             ,CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                       local_110._M_dataplus._M_p._0_4_));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_110._M_dataplus._M_p._4_4_,local_110._M_dataplus._M_p._0_4_)
                    != &local_110.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_110._M_dataplus._M_p._4_4_,
                                           local_110._M_dataplus._M_p._0_4_),
                                  local_110.field_2._M_allocated_capacity + 1);
                }
              }
            }
            lVar15 = lVar15 + 1;
            pTVar11 = local_e8;
          } while (lVar15 == 1);
        }
        bVar6 = false;
        if (pTVar11->orientation != Invalid) {
          pPVar9 = PropertyDictionary::GetProperty(local_e0,pTVar11->orientation);
          local_110._M_dataplus._M_p._0_4_ = 0.0;
          Variant::GetInto<int,_0>(&pPVar9->value,(int *)&local_110);
          local_88->orientation = (TileOrientation)local_110._M_dataplus._M_p._0_4_;
        }
      }
LAB_0021343f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) break;
      uVar13 = uVar13 + 1;
      pfVar14 = pfVar14 + 0x13;
      local_111 = local_80 <= uVar13;
    } while (uVar13 != local_80);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return local_111;
}

Assistant:

bool DecoratorTiledInstancer::GetTileProperties(DecoratorTiled::Tile* tiles, Texture* textures, size_t num_tiles_and_textures,
	const PropertyDictionary& properties, const DecoratorInstancerInterface& instancer_interface) const
{
	RMLUI_ASSERT(num_tiles_and_textures == tile_property_ids.size());

	String previous_texture_name;
	Texture previous_texture;

	for (size_t i = 0; i < num_tiles_and_textures; i++)
	{
		const TilePropertyIds& ids = tile_property_ids[i];

		const Property* src_property = properties.GetProperty(ids.src);
		const String texture_name = src_property->Get<String>();

		// Skip the tile if it has no source name.
		// Declaring the name 'auto' is the same as an empty string. This gives an easy way to skip certain
		// tiles in a shorthand since we can't always declare an empty string.
		if (texture_name.empty() || texture_name == "auto")
			continue;

		// We are required to set default values before instancing the tile, thus, all properties should always be
		// dereferencable. If the debugger captures a zero-dereference, check that all properties for every tile is set
		// and default values are set just before instancing.

		DecoratorTiled::Tile& tile = tiles[i];
		Texture& texture = textures[i];

		const Sprite* sprite = instancer_interface.GetSprite(texture_name);

		// A tile is always either a sprite or an image.
		if (sprite)
		{
			tile.position = sprite->rectangle.Position();
			tile.size = sprite->rectangle.Size();
			tile.display_scale = sprite->sprite_sheet->display_scale;

			texture = sprite->sprite_sheet->texture_source.GetTexture(instancer_interface.GetRenderManager());
		}
		else
		{
			// No sprite found, so assume that the name is an image source. Since the common use case is to specify the
			// same texture for all tiles, check the previous texture first before fetching from the global database.
			if (texture_name == previous_texture_name)
			{
				texture = previous_texture;
			}
			else
			{
				texture = instancer_interface.GetTexture(texture_name);

				if (!texture)
					return false;

				previous_texture_name = texture_name;
				previous_texture = texture;
			}
		}

		if (ids.fit != PropertyId::Invalid)
		{
			RMLUI_ASSERT(ids.align_x != PropertyId::Invalid && ids.align_y != PropertyId::Invalid);
			const Property& fit_property = *properties.GetProperty(ids.fit);
			tile.fit_mode = (DecoratorTiled::TileFitMode)fit_property.value.Get<int>();

			if (sprite &&
				(tile.fit_mode == DecoratorTiled::TileFitMode::REPEAT || tile.fit_mode == DecoratorTiled::TileFitMode::REPEAT_X ||
					tile.fit_mode == DecoratorTiled::TileFitMode::REPEAT_Y))
			{
				Log::Message(Log::LT_WARNING, "Decorator 'fit' value is '%s', which is incompatible with sprites", fit_property.ToString().c_str());
				return false;
			}

			const Property* align_properties[2] = {properties.GetProperty(ids.align_x), properties.GetProperty(ids.align_y)};

			for (int dimension = 0; dimension < 2; dimension++)
			{
				using Style::LengthPercentage;

				LengthPercentage& align = tile.align[dimension];
				const Property& property = *align_properties[dimension];
				if (property.unit == Unit::KEYWORD)
				{
					enum { TOP_LEFT, CENTER, BOTTOM_RIGHT };
					switch (property.Get<int>())
					{
					case TOP_LEFT: align = LengthPercentage(LengthPercentage::Percentage, 0.0f); break;
					case CENTER: align = LengthPercentage(LengthPercentage::Percentage, 50.0f); break;
					case BOTTOM_RIGHT: align = LengthPercentage(LengthPercentage::Percentage, 100.0f); break;
					}
				}
				else if (property.unit == Unit::PERCENT)
				{
					align = LengthPercentage(LengthPercentage::Percentage, property.Get<float>());
				}
				else if (property.unit == Unit::PX)
				{
					align = LengthPercentage(LengthPercentage::Length, property.Get<float>());
				}
				else
				{
					Log::Message(Log::LT_WARNING, "Decorator alignment value is '%s' which uses an unsupported unit (use px, %%, or keyword)",
						property.ToString().c_str());
				}
			}
		}

		if (ids.orientation != PropertyId::Invalid)
		{
			const Property& orientation_property = *properties.GetProperty(ids.orientation);
			tile.orientation = (DecoratorTiled::TileOrientation)orientation_property.value.Get<int>();
		}
	}

	return true;
}